

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O0

int uv__epoll_init(uv_loop_t *loop)

{
  int *piVar1;
  int local_1c;
  int fd;
  uv_loop_t *loop_local;
  
  local_1c = epoll_create1(0x80000);
  if ((local_1c == -1) &&
     (((piVar1 = __errno_location(), *piVar1 == 0x26 ||
       (piVar1 = __errno_location(), *piVar1 == 0x16)) &&
      (local_1c = epoll_create(0x100), local_1c != -1)))) {
    uv__cloexec_ioctl(local_1c,1);
  }
  loop->backend_fd = local_1c;
  if (local_1c == -1) {
    piVar1 = __errno_location();
    loop_local._4_4_ = -*piVar1;
  }
  else {
    loop_local._4_4_ = 0;
  }
  return loop_local._4_4_;
}

Assistant:

int uv__epoll_init(uv_loop_t* loop) {
  int fd;
  fd = epoll_create1(O_CLOEXEC);

  /* epoll_create1() can fail either because it's not implemented (old kernel)
   * or because it doesn't understand the O_CLOEXEC flag.
   */
  if (fd == -1 && (errno == ENOSYS || errno == EINVAL)) {
    fd = epoll_create(256);

    if (fd != -1)
      uv__cloexec(fd, 1);
  }

  loop->backend_fd = fd;
  if (fd == -1)
    return UV__ERR(errno);

  return 0;
}